

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

_Bool get_move_flee(monster *mon)

{
  bool bVar1;
  loc lVar2;
  ulong uVar3;
  _Bool _Var4;
  wchar_t wVar5;
  int iVar6;
  loc grid;
  int iVar7;
  uint uVar8;
  int local_44;
  ulong local_40;
  loc local_38;
  
  local_38 = (loc)loc(0,0);
  _Var4 = monster_taking_terrain_damage((chunk *)cave,(monster_conflict *)mon);
  if (!_Var4) {
    local_40 = (ulong)mon->cdis;
    if (mon->best_range <= mon->cdis) goto LAB_0017b4cd;
    _Var4 = monster_can_hear(mon);
    if (!_Var4) {
      _Var4 = monster_can_smell(mon);
      local_40 = (ulong)_Var4;
      if (!_Var4) goto LAB_0017b4cd;
    }
  }
  local_40 = (ulong)local_38 >> 0x20;
  local_44 = -1;
  for (uVar8 = 7; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
    grid = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[uVar8]);
    _Var4 = square_in_bounds(cave,grid);
    uVar3 = local_40;
    if (_Var4) {
      wVar5 = distance((loc_conflict)grid,(mon->target).grid);
      iVar7 = (int)(5000 / (long)(wVar5 + L'\x03')) -
              (int)(500 / (ulong)((cave->noise).grids[(long)grid >> 0x20][grid.x] + 1));
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      lVar2 = grid;
      if (iVar7 < local_44) {
        lVar2 = local_38;
      }
      local_38 = (loc)((ulong)lVar2 & 0xffffffff);
      iVar6 = local_44;
      if (local_44 < iVar7) {
        iVar6 = iVar7;
      }
      bVar1 = iVar7 < local_44;
      local_44 = iVar6;
      uVar3 = (ulong)grid >> 0x20;
      if (bVar1) {
        uVar3 = local_40;
      }
    }
    local_40 = uVar3;
  }
  (mon->target).grid.x = local_38.x;
  (mon->target).grid.y = (int)local_40;
LAB_0017b4cd:
  return SUB81(local_40,0);
}

Assistant:

static bool get_move_flee(struct monster *mon)
{
	int i;
	struct loc best = loc(0, 0);
	int best_score = -1;

	/* Taking damage from terrain makes moving vital */
	if (!monster_taking_terrain_damage(cave, mon)) {
		/* If the player is not currently near the monster, no reason to flow */
		if (mon->cdis >= mon->best_range) {
			return false;
		}

		/* Monster is too far away to use sound or scent */
		if (!monster_can_hear(mon) && !monster_can_smell(mon)) {
			return false;
		}
	}

	/* Check nearby grids, diagonals first */
	for (i = 7; i >= 0; i--) {
		int dis, score;

		/* Get the location */
		struct loc grid = loc_sum(mon->grid, ddgrid_ddd[i]);

		/* Bounds check */
		if (!square_in_bounds(cave, grid)) continue;

		/* Calculate distance of this grid from our target */
		dis = distance(grid, mon->target.grid);

		/* Score this grid
		 * First half of calculation is inversely proportional to distance
		 * Second half is inversely proportional to grid's distance from player
		 */
		score = 5000 / (dis + 3) - 500 /(cave->noise.grids[grid.y][grid.x] + 1);

		/* No negative scores */
		if (score < 0) score = 0;

		/* Ignore lower scores */
		if (score < best_score) continue;

		/* Save the score */
		best_score = score;

		/* Save the location */
		best = grid;
	}

	/* Set the immediate target */
	mon->target.grid = best;

	/* Success */
	return true;
}